

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O2

void ZopfliLZ77GetHistogramAt(ZopfliLZ77Store *lz77,size_t lpos,size_t *ll_counts,size_t *d_counts)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = lpos - lpos % 0x120;
  psVar1 = lz77->ll_counts;
  for (lVar5 = 0; lVar5 != 0x120; lVar5 = lVar5 + 1) {
    ll_counts[lVar5] = psVar1[lVar4 + lVar5];
  }
  uVar3 = lpos + 1;
  for (uVar2 = uVar3; (uVar2 < lVar4 + 0x120U && (uVar2 < lz77->size)); uVar2 = uVar2 + 1) {
    ll_counts[lz77->ll_symbol[uVar2]] = ll_counts[lz77->ll_symbol[uVar2]] - 1;
  }
  psVar1 = lz77->d_counts;
  for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
    d_counts[lVar4] = psVar1[(lpos & 0xffffffffffffffe0) + lVar4];
  }
  for (; (uVar3 < (lpos & 0xffffffffffffffe0) + 0x20 && (uVar3 < lz77->size)); uVar3 = uVar3 + 1) {
    if (lz77->dists[uVar3] != 0) {
      d_counts[lz77->d_symbol[uVar3]] = d_counts[lz77->d_symbol[uVar3]] - 1;
    }
  }
  return;
}

Assistant:

static void ZopfliLZ77GetHistogramAt(const ZopfliLZ77Store* lz77, size_t lpos,
                                     size_t* ll_counts, size_t* d_counts) {
  /* The real histogram is created by using the histogram for this chunk, but
  all superfluous values of this chunk subtracted. */
  size_t llpos = ZOPFLI_NUM_LL * (lpos / ZOPFLI_NUM_LL);
  size_t dpos = ZOPFLI_NUM_D * (lpos / ZOPFLI_NUM_D);
  size_t i;
  for (i = 0; i < ZOPFLI_NUM_LL; i++) {
    ll_counts[i] = lz77->ll_counts[llpos + i];
  }
  for (i = lpos + 1; i < llpos + ZOPFLI_NUM_LL && i < lz77->size; i++) {
    ll_counts[lz77->ll_symbol[i]]--;
  }
  for (i = 0; i < ZOPFLI_NUM_D; i++) {
    d_counts[i] = lz77->d_counts[dpos + i];
  }
  for (i = lpos + 1; i < dpos + ZOPFLI_NUM_D && i < lz77->size; i++) {
    if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]--;
  }
}